

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

void __thiscall Js::AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo(AutoRestoreFunctionInfo *this)

{
  FunctionInfo *this_00;
  ParseableFunctionInfo *this_01;
  code *pcVar1;
  bool bVar2;
  FunctionBody *this_02;
  undefined4 *puVar3;
  ParseableFunctionInfo *this_03;
  FunctionInfo *functionInfo;
  
  this_03 = this->pfi;
  if (this_03 != (ParseableFunctionInfo *)0x0) {
    this_00 = (this_03->super_FunctionProxy).functionInfo.ptr;
    this_01 = (ParseableFunctionInfo *)(this_00->functionBodyImpl).ptr;
    if (this_01 != this_03) {
      this_02 = FunctionProxy::GetFunctionBody((FunctionProxy *)this_01);
      FunctionBody::RedeferFunctionObjectTypes(this_02);
      *(undefined1 *)&this_00->attributes = (char)this_00->attributes | DeferredParse;
      Memory::WriteBarrierPtr<Js::FunctionProxy>::WriteBarrierSet
                (&this_00->functionBodyImpl,&this->pfi->super_FunctionProxy);
      FunctionInfo::SetOriginalEntryPoint(this_00,this->originalEntryPoint);
      this_03 = this->pfi;
      if (this_03 == (ParseableFunctionInfo *)0x0) {
        return;
      }
    }
    if (((ParseableFunctionInfo *)
         (((this_03->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr == this_03) &&
       (bVar2 = FunctionProxy::IsFunctionBody(&this_03->super_FunctionProxy), !bVar2)) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xd86,
                                "(this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody()))"
                                ,
                                "this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

~AutoRestoreFunctionInfo() {
            if (this->pfi != nullptr && this->pfi->GetFunctionInfo()->GetFunctionProxy() != this->pfi)
            {
                FunctionInfo *functionInfo = this->pfi->GetFunctionInfo();
                FunctionBody *functionBody = functionInfo->GetFunctionProxy()->GetFunctionBody();
                functionBody->RedeferFunctionObjectTypes();
                functionInfo->SetAttributes(
                    (FunctionInfo::Attributes)(functionInfo->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
                functionInfo->SetFunctionProxy(this->pfi);
                functionInfo->SetOriginalEntryPoint(originalEntryPoint);
            }

            Assert(this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody()));
        }